

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Equiv2(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *p;
  bool bVar1;
  int iVar2;
  uint nFramesMax;
  uint uVar3;
  uint fLatchOnly;
  uint fVerbose;
  Abc_Cex_t *pCex;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  
  local_50 = 0;
  Extra_UtilGetoptReset();
  local_58 = 10;
  local_5c = 500;
  nFramesMax = 0x14;
  local_54 = 0;
  bVar1 = false;
  fLatchOnly = 0;
  fVerbose = 0;
LAB_002289ac:
  iVar2 = Extra_UtilGetopt(argc,argv,"FCRTSxlvh");
  iVar6 = globalUtilOptind;
  if (iVar2 < 0x54) {
    if (0x51 < iVar2) {
      if (iVar2 == 0x52) {
        if (globalUtilOptind < argc) {
          local_58 = atoi(argv[globalUtilOptind]);
          uVar3 = local_58;
          goto joined_r0x002289f8;
        }
        pcVar4 = "Command line switch \"-R\" should be followed by an integer.\n";
        goto LAB_00228b95;
      }
      if (iVar2 != 0x53) goto LAB_00228ba1;
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-S\" should be followed by an integer.\n";
        goto LAB_00228b95;
      }
      local_54 = atoi(argv[globalUtilOptind]);
      uVar3 = local_54;
joined_r0x002289f8:
      globalUtilOptind = iVar6 + 1;
      if ((int)uVar3 < 0) {
LAB_00228ba1:
        Abc_Print(-2,"usage: &equiv2 [-FCRTS num] [-xlvh]\n");
        Abc_Print(-2,"\t         computes candidate equivalence classes\n");
        Abc_Print(-2,"\t-F num : the max number of frames for BMC [default = %d]\n",
                  (ulong)nFramesMax);
        Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
                  (ulong)local_5c);
        Abc_Print(-2,"\t-R num : the max number of BMC rounds [default = %d]\n",(ulong)local_58);
        Abc_Print(-2,"\t-T num : runtime limit in seconds for all rounds [default = %d]\n",
                  (ulong)local_50);
        Abc_Print(-2,"\t-S num : runtime limit in seconds for one round [default = %d]\n",
                  (ulong)local_54);
        pcVar5 = "yes";
        pcVar4 = "yes";
        if (!bVar1) {
          pcVar4 = "no";
        }
        Abc_Print(-2,
                  "\t-x     : toggle using the current cex to perform refinement [default = %s]\n",
                  pcVar4);
        pcVar4 = "yes";
        if (fLatchOnly == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-l     : toggle considering only latch output equivalences [default = %s]\n"
                  ,pcVar4);
        if (fVerbose == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
        pcVar4 = "\t-h     : print the command usage\n";
        iVar6 = -2;
LAB_00228cb0:
        Abc_Print(iVar6,pcVar4);
        return 1;
      }
      goto LAB_002289ac;
    }
    if (iVar2 != 0x43) {
      if (iVar2 == 0x46) {
        if (globalUtilOptind < argc) {
          nFramesMax = atoi(argv[globalUtilOptind]);
          uVar3 = nFramesMax;
          goto joined_r0x002289f8;
        }
        pcVar4 = "Command line switch \"-F\" should be followed by an integer.\n";
        goto LAB_00228b95;
      }
      if (iVar2 == -1) {
        p = pAbc->pGia;
        if (p != (Gia_Man_t *)0x0) {
          if (p->nRegs == 0) {
            pcVar4 = "Abc_CommandAbc9Equiv2(): There is no flops. Nothing is done.\n";
LAB_00228d25:
            Abc_Print(0,pcVar4);
            return 0;
          }
          if (bVar1) {
            if (pAbc->pCex == (Abc_Cex_t *)0x0) {
              pcVar4 = "Abc_CommandAbc9Equiv2(): Counter-example is not available.\n";
              goto LAB_00228d25;
            }
            if (pAbc->pCex->nPis != p->vCis->nSize - p->nRegs) {
              Abc_Print(-1,
                        "Abc_CommandAbc9Equiv2(): The number of PIs differs in cex (%d) and in AIG (%d).\n"
                       );
              return 1;
            }
            if (bVar1) {
              pCex = pAbc->pCex;
              goto LAB_00228ce6;
            }
          }
          pCex = (Abc_Cex_t *)0x0;
LAB_00228ce6:
          Ssw_SignalFilterGia(p,nFramesMax,local_5c,local_58,local_50,local_54,pCex,fLatchOnly,
                              fVerbose);
          pAbc->Status = -1;
          return 0;
        }
        pcVar4 = "Abc_CommandAbc9Equiv2(): There is no AIG.\n";
        iVar6 = -1;
        goto LAB_00228cb0;
      }
      goto LAB_00228ba1;
    }
    if (globalUtilOptind < argc) {
      local_5c = atoi(argv[globalUtilOptind]);
      uVar3 = local_5c;
      goto joined_r0x002289f8;
    }
    pcVar4 = "Command line switch \"-C\" should be followed by an integer.\n";
  }
  else {
    if (0x75 < iVar2) {
      if (iVar2 == 0x76) {
        fVerbose = fVerbose ^ 1;
      }
      else {
        if (iVar2 != 0x78) goto LAB_00228ba1;
        bVar1 = (bool)(bVar1 ^ 1);
      }
      goto LAB_002289ac;
    }
    if (iVar2 != 0x54) {
      if (iVar2 != 0x6c) goto LAB_00228ba1;
      fLatchOnly = fLatchOnly ^ 1;
      goto LAB_002289ac;
    }
    if (globalUtilOptind < argc) {
      local_50 = atoi(argv[globalUtilOptind]);
      uVar3 = local_50;
      goto joined_r0x002289f8;
    }
    pcVar4 = "Command line switch \"-T\" should be followed by an integer.\n";
  }
LAB_00228b95:
  Abc_Print(-1,pcVar4);
  goto LAB_00228ba1;
}

Assistant:

int Abc_CommandAbc9Equiv2( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Ssw_SignalFilterGia( Gia_Man_t * p, int nFramesMax, int nConfMax, int nRounds, int TimeLimit, int TimeLimit2, Abc_Cex_t * pCex, int fLatchOnly, int fVerbose );
    int nFramesMax =   20;
    int nConfMax   =  500;
    int nRounds    =   10;
    int TimeLimit  =    0;
    int TimeLimit2 =    0;
    int fUseCex    =    0;
    int fLatchOnly =    0;
    int fVerbose   =    0;
    int c;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FCRTSxlvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFramesMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFramesMax < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfMax < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            nRounds = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nRounds < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            TimeLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( TimeLimit < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            TimeLimit2 = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( TimeLimit2 < 0 )
                goto usage;
            break;
        case 'x':
            fUseCex ^= 1;
            break;
        case 'l':
            fLatchOnly ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Equiv2(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( 0, "Abc_CommandAbc9Equiv2(): There is no flops. Nothing is done.\n" );
        return 0;
    }
    if ( fUseCex )
    {
        if ( pAbc->pCex == NULL )
        {
            Abc_Print( 0, "Abc_CommandAbc9Equiv2(): Counter-example is not available.\n" );
            return 0;
        }
        if ( pAbc->pCex->nPis != Gia_ManPiNum(pAbc->pGia) )
        {
            Abc_Print( -1, "Abc_CommandAbc9Equiv2(): The number of PIs differs in cex (%d) and in AIG (%d).\n",
                pAbc->pCex->nPis, Gia_ManPiNum(pAbc->pGia) );
            return 1;
        }
    }
    Ssw_SignalFilterGia( pAbc->pGia, nFramesMax, nConfMax, nRounds, TimeLimit, TimeLimit2, fUseCex? pAbc->pCex: NULL, fLatchOnly, fVerbose );
    pAbc->Status  = -1;
//    pAbc->nFrames = pAbc->pCex->iFrame;
//    Abc_FrameReplaceCex( pAbc, &pAbc->pCex );
    return 0;

usage:
    Abc_Print( -2, "usage: &equiv2 [-FCRTS num] [-xlvh]\n" );
    Abc_Print( -2, "\t         computes candidate equivalence classes\n" );
    Abc_Print( -2, "\t-F num : the max number of frames for BMC [default = %d]\n", nFramesMax );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", nConfMax );
    Abc_Print( -2, "\t-R num : the max number of BMC rounds [default = %d]\n", nRounds );
    Abc_Print( -2, "\t-T num : runtime limit in seconds for all rounds [default = %d]\n", TimeLimit );
    Abc_Print( -2, "\t-S num : runtime limit in seconds for one round [default = %d]\n", TimeLimit2 );
    Abc_Print( -2, "\t-x     : toggle using the current cex to perform refinement [default = %s]\n", fUseCex? "yes": "no" );
    Abc_Print( -2, "\t-l     : toggle considering only latch output equivalences [default = %s]\n", fLatchOnly? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}